

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Float __thiscall
pbrt::FloatCheckerboardTexture::Evaluate(FloatCheckerboardTexture *this,TextureEvalContext ctx)

{
  undefined1 auVar1 [16];
  float fVar2;
  Float FVar3;
  Float FVar4;
  float fVar5;
  undefined1 auVar6 [64];
  TaggedPointer<pbrt::TransformMapping3D> local_68;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_60;
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [3];
  int iStack_1c;
  undefined1 extraout_var [56];
  
  local_60.bits =
       (this->map2D).
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       .bits;
  local_68.bits = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  auVar6._0_8_ = Checkerboard(this->aaMethod,ctx,(TextureMapping2DHandle *)&local_60,
                              (TextureMapping3DHandle *)&local_68);
  auVar6._8_56_ = extraout_var;
  auVar1 = vmovshdup_avx(auVar6._0_16_);
  fVar2 = auVar6._0_4_;
  fVar5 = auVar1._0_4_;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      aTStack_40[1].z = ctx.dudx;
      aTStack_40[2].x = ctx.dudy;
      aTStack_40[2].y = ctx.dvdx;
      aTStack_40[2].z = ctx.dvdy;
      iStack_1c = ctx.faceIndex;
      FVar3 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
              ::
              Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                        ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                          *)this->tex,(TextureEvalContext *)local_58);
      local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      aTStack_40[1].z = ctx.dudx;
      aTStack_40[2].x = ctx.dudy;
      aTStack_40[2].y = ctx.dvdx;
      aTStack_40[2].z = ctx.dvdy;
      iStack_1c = ctx.faceIndex;
      FVar4 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
              ::
              Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                        ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                          *)(this->tex + 1),(TextureEvalContext *)local_58);
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)(FVar4 * fVar5)),ZEXT416((uint)FVar3),
                               ZEXT416((uint)fVar2));
      fVar5 = auVar1._0_4_;
    }
    else {
      local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      aTStack_40[1].z = ctx.dudx;
      aTStack_40[2].x = ctx.dudy;
      aTStack_40[2].y = ctx.dvdx;
      aTStack_40[2].z = ctx.dvdy;
      iStack_1c = ctx.faceIndex;
      FVar3 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
              ::
              Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                        ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                          *)this->tex,(TextureEvalContext *)local_58);
      fVar5 = FVar3 * fVar2;
    }
  }
  else {
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    iStack_1c = ctx.faceIndex;
    FVar3 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
            ::
            Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                        *)(this->tex + 1),(TextureEvalContext *)local_58);
    fVar5 = FVar3 * fVar5;
  }
  return fVar5;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        pstd::array<Float, 2> wt = Checkerboard(aaMethod, ctx, map2D, map3D);
        if (wt[0] == 0)
            return wt[1] * tex[1].Evaluate(ctx);
        else if (wt[1] == 0)
            return wt[0] * tex[0].Evaluate(ctx);
        else
            return wt[0] * tex[0].Evaluate(ctx) + wt[1] * tex[1].Evaluate(ctx);
    }